

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composable.cpp
# Opt level: O2

int main(void)

{
  anon_enum_32 aVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  Coro coroutine;
  
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>
  .super_PrintStart<SCoro::Impl::Nothing>.input =
       (PrintStart<SCoro::Impl::Nothing>)anon_var_dwarf_1382;
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .nested_state.super_type.
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
  .
  super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
  .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
       (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
        )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
          )0x0;
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = 0;
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_type.
  super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
  .
  super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
  .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
       (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
        )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
          )0x0;
  coroutine.super_type.
  super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .
  super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
  .
  super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
  .nested_state.super_EboIndex<2UL>.index = 0;
  coroutine.super_EboIndex<5UL>.index = 0;
  do {
    while( true ) {
      aVar1 = SCoro::
              Poll<SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>>
                        (&coroutine);
      if (aVar1 == End) break;
      putchar(0x2d);
      local_70.__r = 10;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_70);
    }
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>
    .super_PrintStart<SCoro::Impl::Nothing>.input =
         (PrintStart<SCoro::Impl::Nothing>)anon_var_dwarf_1382;
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .nested_state.super_EboIndex<2UL>.index = 0;
    coroutine.super_EboIndex<5UL>.index = 0;
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
    .nested_state.super_EboIndex<2UL>.index = (EboIndex<2UL>)0;
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .nested_state.super_type.
    super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
    .
    super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
    .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
         (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>_>
          )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>::RecordTime>
            )0x0;
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
    .nested_state.super_type.
    super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
    .
    super_StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
    .super_RecordTime<SCoro::Impl::Nothing>.start_time.__d.__r =
         (WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>_>
          )(StagesImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_2UL,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime>
            )0x0;
    coroutine.super_type.
    super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
    .
    super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
    .
    super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
    .
    super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>
    .nested_state.super_EboIndex<2UL>.index = 0;
    putchar(10);
  } while( true );
}

Assistant:

int main()
{
    Coro coroutine{"composable"};
    while (true)
    {
        while ( coroutine.Poll() != SCoro::Result::End )
        {
            std::putchar('-');
            std::this_thread::sleep_for(std::chrono::milliseconds{10});
        }
        // This resets coroutine state.
        coroutine.Reset("composable");
        std::printf("\n");
    }
    return 0;
}